

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode
          (MoveFromMemByRegToMemByReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CExpression *pCVar1;
  CTemp *pCVar2;
  CTempExpression *local_1c0;
  CTempExpression *local_1b0;
  CMemExpression *local_1a0;
  CMemExpression *local_190;
  CMoveStatement *local_180;
  undefined1 local_170 [16];
  CExpression *local_160;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_158;
  pair<IRT::CTemp,_const_IRT::INode_*> local_130;
  CExpression *local_108;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_100;
  pair<IRT::CTemp,_const_IRT::INode_*> local_d8;
  undefined1 local_a0 [8];
  CTemp rightRegister;
  CTemp leftRegister;
  ConstTempPtr sourceRegPtr;
  ConstTempPtr targetRegPtr;
  ConstMemPtr rightMemPtr;
  ConstMemPtr leftMemPtr;
  ConstMovePtr movePtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MoveFromMemByRegToMemByReg *this_local;
  
  if (tree == (INode *)0x0) {
    local_180 = (CMoveStatement *)0x0;
  }
  else {
    local_180 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  }
  if (local_180 != (CMoveStatement *)0x0) {
    pCVar1 = CMoveStatement::Target(local_180);
    if (pCVar1 == (CExpression *)0x0) {
      local_190 = (CMemExpression *)0x0;
    }
    else {
      local_190 = (CMemExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    pCVar1 = CMoveStatement::Source(local_180);
    if (pCVar1 == (CExpression *)0x0) {
      local_1a0 = (CMemExpression *)0x0;
    }
    else {
      local_1a0 = (CMemExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    if ((local_190 != (CMemExpression *)0x0) && (local_1a0 != (CMemExpression *)0x0)) {
      pCVar1 = CMemExpression::getAddress(local_190);
      if (pCVar1 == (CExpression *)0x0) {
        local_1b0 = (CTempExpression *)0x0;
      }
      else {
        local_1b0 = (CTempExpression *)
                    __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      pCVar1 = CMemExpression::getAddress(local_1a0);
      if (pCVar1 == (CExpression *)0x0) {
        local_1c0 = (CTempExpression *)0x0;
      }
      else {
        local_1c0 = (CTempExpression *)
                    __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      CTemp::CTemp((CTemp *)&rightRegister.field_0x18);
      CTemp::CTemp((CTemp *)local_a0);
      if (local_1b0 == (CTempExpression *)0x0) {
        local_108 = CMemExpression::getAddress(local_190);
        std::make_pair<IRT::CTemp&,IRT::CExpression_const*>
                  (&local_100,(CTemp *)&rightRegister.field_0x18,&local_108);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_d8,&local_100);
        std::
        vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ::push_back(children,&local_d8);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_d8);
        std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_100);
      }
      else {
        pCVar2 = CTempExpression::getTemprorary(local_1b0);
        CTemp::operator=((CTemp *)&rightRegister.field_0x18,pCVar2);
      }
      if (local_1c0 == (CTempExpression *)0x0) {
        local_160 = CMemExpression::getAddress(local_1a0);
        std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_158,(CTemp *)local_a0,&local_160)
        ;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_130,&local_158);
        std::
        vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ::push_back(children,&local_130);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_130);
        std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_158);
      }
      else {
        pCVar2 = CTempExpression::getTemprorary(local_1c0);
        CTemp::operator=((CTemp *)local_a0,pCVar2);
      }
      std::make_shared<AssemblyCode::MoveRegFromMemToMemByReg,IRT::CTemp&,IRT::CTemp&>
                ((CTemp *)local_170,(CTemp *)&rightRegister.field_0x18);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg> *)local_170);
      std::shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg> *)local_170);
      CTemp::~CTemp((CTemp *)local_a0);
      CTemp::~CTemp((CTemp *)&rightRegister.field_0x18);
      return true;
    }
  }
  return false;
}

Assistant:

bool IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr leftMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        ConstMemPtr rightMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        if ( leftMemPtr && rightMemPtr ) {
            ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(leftMemPtr->getAddress( ));
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(rightMemPtr->getAddress( ));
            CTemp leftRegister;
            CTemp rightRegister;
            if ( !targetRegPtr ) {
                children.push_back( std::make_pair( leftRegister, leftMemPtr->getAddress( )));
            } else {
                leftRegister = targetRegPtr->getTemprorary( );
            }
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, rightMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegFromMemToMemByReg>( leftRegister,
                                                                                             rightRegister ));
            return true;
        }
    }
    return false;
}